

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetExportName_abi_cxx11_(string *__return_storage_ptr__,cmGeneratorTarget *this)

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  allocator<char> local_1f9;
  string local_1f8;
  ostringstream local_1d8 [8];
  ostringstream e;
  allocator<char> local_41;
  string local_40;
  cmValue local_20;
  cmValue exportName;
  cmGeneratorTarget *this_local;
  
  exportName.Value = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"EXPORT_NAME",&local_41);
  local_20 = GetProperty(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  bVar1 = cmNonempty(local_20);
  if (bVar1) {
    psVar3 = cmValue::operator*[abi_cxx11_(&local_20);
    bVar1 = cmGeneratorExpression::IsValidTargetName(psVar3);
    if (bVar1) {
      psVar3 = cmValue::operator*[abi_cxx11_(&local_20);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1d8);
      poVar2 = std::operator<<((ostream *)local_1d8,"EXPORT_NAME property \"");
      psVar3 = cmValue::operator*[abi_cxx11_(&local_20);
      poVar2 = std::operator<<(poVar2,(string *)psVar3);
      poVar2 = std::operator<<(poVar2,"\" for \"");
      psVar3 = GetName_abi_cxx11_(this);
      poVar2 = std::operator<<(poVar2,(string *)psVar3);
      std::operator<<(poVar2,"\": is not valid.");
      std::__cxx11::ostringstream::str();
      cmSystemTools::Error(&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_1f9);
      std::allocator<char>::~allocator(&local_1f9);
      std::__cxx11::ostringstream::~ostringstream(local_1d8);
    }
  }
  else {
    psVar3 = GetName_abi_cxx11_(this);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetExportName() const
{
  cmValue exportName = this->GetProperty("EXPORT_NAME");

  if (cmNonempty(exportName)) {
    if (!cmGeneratorExpression::IsValidTargetName(*exportName)) {
      std::ostringstream e;
      e << "EXPORT_NAME property \"" << *exportName << "\" for \""
        << this->GetName() << "\": is not valid.";
      cmSystemTools::Error(e.str());
      return "";
    }
    return *exportName;
  }
  return this->GetName();
}